

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

leveldb_t * leveldb_open(leveldb_options_t *options,char *name,char **errptr)

{
  bool bVar1;
  leveldb_t *result;
  allocator local_59;
  string local_58 [32];
  DB local_38;
  Comparator *local_30;
  DB *db;
  char **errptr_local;
  char *name_local;
  leveldb_options_t *options_local;
  
  db = (DB *)errptr;
  errptr_local = (char **)name;
  name_local = (char *)options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,name,&local_59);
  leveldb::DB::Open(&local_38,&options->rep,(string *)local_58,(DB **)&local_30);
  bVar1 = SaveError(errptr,(Status *)&local_38);
  leveldb::Status::~Status((Status *)&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (bVar1) {
    options_local = (leveldb_options_t *)0x0;
  }
  else {
    options_local = (leveldb_options_t *)operator_new(8);
    (options_local->rep).comparator = local_30;
  }
  return (leveldb_t *)options_local;
}

Assistant:

leveldb_t* leveldb_open(const leveldb_options_t* options, const char* name,
                        char** errptr) {
  DB* db;
  if (SaveError(errptr, DB::Open(options->rep, std::string(name), &db))) {
    return nullptr;
  }
  leveldb_t* result = new leveldb_t;
  result->rep = db;
  return result;
}